

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclCnRunner.cpp
# Opt level: O3

void __thiscall xmrig::OclCnRunner::OclCnRunner(OclCnRunner *this,size_t index,OclLaunchData *data)

{
  string *psVar1;
  OclVendor OVar2;
  bool bVar3;
  char cVar4;
  char cVar5;
  long *plVar6;
  long *plVar7;
  uint uVar8;
  uint uVar9;
  initializer_list<_cl_mem_*> __l;
  initializer_list<xmrig::CnBranchKernel_*> __l_00;
  string __str_5;
  string __str;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  char *local_70;
  uint local_68;
  char local_60 [16];
  OclLaunchData *local_50;
  vector<xmrig::CnBranchKernel_*,_std::allocator<xmrig::CnBranchKernel_*>_> *local_48;
  vector<_cl_mem_*,_std::allocator<_cl_mem_*>_> *local_40;
  OclCnRunner *local_38;
  
  local_50 = data;
  OclBaseRunner::OclBaseRunner(&this->super_OclBaseRunner,index,data);
  (this->super_OclBaseRunner).super_IOclRunner._vptr_IOclRunner =
       (_func_int **)&PTR__OclCnRunner_001ad290;
  this->m_scratchpads = (cl_mem)0x0;
  this->m_states = (cl_mem)0x0;
  this->m_cnr = (cl_program)0x0;
  this->m_cn0 = (Cn0Kernel *)0x0;
  this->m_cn1 = (Cn1Kernel *)0x0;
  this->m_cn2 = (Cn2Kernel *)0x0;
  this->m_height = 0;
  __l._M_len = 4;
  __l._M_array = (iterator)&DAT_0018c1d0;
  local_38 = this;
  std::vector<_cl_mem_*,_std::allocator<_cl_mem_*>_>::vector
            (&this->m_branches,__l,(allocator_type *)&local_b0);
  __l_00._M_len = 4;
  __l_00._M_array = (iterator)&DAT_0018c1f0;
  local_40 = &this->m_branches;
  std::vector<xmrig::CnBranchKernel_*,_std::allocator<xmrig::CnBranchKernel_*>_>::vector
            (&this->m_branchKernels,__l_00,(allocator_type *)&local_b0);
  OVar2 = (local_50->device).m_vendorId;
  local_70 = local_60;
  local_48 = &this->m_branchKernels;
  std::__cxx11::string::_M_construct((ulong)&local_70,'\x06');
  std::__detail::__to_chars_10_impl<unsigned_int>(local_70,local_68,0x20000);
  plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x18c214);
  plVar7 = plVar6 + 2;
  if ((long *)*plVar6 == plVar7) {
    local_80 = *plVar7;
    lStack_78 = plVar6[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar7;
    local_90 = (long *)*plVar6;
  }
  local_88 = plVar6[1];
  *plVar6 = (long)plVar7;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_90);
  plVar7 = plVar6 + 2;
  if ((long *)*plVar6 == plVar7) {
    local_a0 = *plVar7;
    lStack_98 = plVar6[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *plVar7;
    local_b0 = (long *)*plVar6;
  }
  local_a8 = plVar6[1];
  *plVar6 = (long)plVar7;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  psVar1 = &(this->super_OclBaseRunner).m_options;
  std::__cxx11::string::_M_append((char *)psVar1,(ulong)local_b0);
  if (local_b0 != &local_a0) {
    operator_delete(local_b0);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90);
  }
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  local_70 = local_60;
  std::__cxx11::string::_M_construct((ulong)&local_70,'\a');
  std::__detail::__to_chars_10_impl<unsigned_long>(local_70,local_68,0xffff0);
  plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x18c223);
  plVar7 = plVar6 + 2;
  if ((long *)*plVar6 == plVar7) {
    local_80 = *plVar7;
    lStack_78 = plVar6[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar7;
    local_90 = (long *)*plVar6;
  }
  local_88 = plVar6[1];
  *plVar6 = (long)plVar7;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_90);
  plVar7 = plVar6 + 2;
  if ((long *)*plVar6 == plVar7) {
    local_a0 = *plVar7;
    lStack_98 = plVar6[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *plVar7;
    local_b0 = (long *)*plVar6;
  }
  local_a8 = plVar6[1];
  *plVar6 = (long)plVar7;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  std::__cxx11::string::_M_append((char *)psVar1,(ulong)local_b0);
  if (local_b0 != &local_a0) {
    operator_delete(local_b0);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90);
  }
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  uVar8 = (local_50->thread).m_worksize;
  cVar5 = '\x01';
  if (9 < uVar8) {
    uVar9 = uVar8;
    cVar4 = '\x04';
    do {
      cVar5 = cVar4;
      if (uVar9 < 100) {
        cVar5 = cVar5 + -2;
        goto LAB_001642c5;
      }
      if (uVar9 < 1000) {
        cVar5 = cVar5 + -1;
        goto LAB_001642c5;
      }
      if (uVar9 < 10000) goto LAB_001642c5;
      bVar3 = 99999 < uVar9;
      uVar9 = uVar9 / 10000;
      cVar4 = cVar5 + '\x04';
    } while (bVar3);
    cVar5 = cVar5 + '\x01';
  }
LAB_001642c5:
  local_70 = local_60;
  std::__cxx11::string::_M_construct((ulong)&local_70,cVar5);
  std::__detail::__to_chars_10_impl<unsigned_int>(local_70,local_68,uVar8);
  plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x18c22c);
  plVar7 = plVar6 + 2;
  if ((long *)*plVar6 == plVar7) {
    local_80 = *plVar7;
    lStack_78 = plVar6[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar7;
    local_90 = (long *)*plVar6;
  }
  local_88 = plVar6[1];
  *plVar6 = (long)plVar7;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_90);
  plVar7 = plVar6 + 2;
  if ((long *)*plVar6 == plVar7) {
    local_a0 = *plVar7;
    lStack_98 = plVar6[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *plVar7;
    local_b0 = (long *)*plVar6;
  }
  local_a8 = plVar6[1];
  *plVar6 = (long)plVar7;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  std::__cxx11::string::_M_append((char *)psVar1,(ulong)local_b0);
  if (local_b0 != &local_a0) {
    operator_delete(local_b0);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90);
  }
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  local_70 = local_60;
  std::__cxx11::string::_M_construct((ulong)&local_70,'\x01');
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_70,local_68,(uint)(OVar2 != OCL_VENDOR_NVIDIA) * 2);
  plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x18c239);
  plVar7 = plVar6 + 2;
  if ((long *)*plVar6 == plVar7) {
    local_80 = *plVar7;
    lStack_78 = plVar6[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar7;
    local_90 = (long *)*plVar6;
  }
  local_88 = plVar6[1];
  *plVar6 = (long)plVar7;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_90);
  plVar7 = plVar6 + 2;
  if ((long *)*plVar6 == plVar7) {
    local_a0 = *plVar7;
    lStack_98 = plVar6[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *plVar7;
    local_b0 = (long *)*plVar6;
  }
  local_a8 = plVar6[1];
  *plVar6 = (long)plVar7;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  std::__cxx11::string::_M_append((char *)psVar1,(ulong)local_b0);
  if (local_b0 != &local_a0) {
    operator_delete(local_b0);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90);
  }
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  uVar8 = (local_50->thread).m_memChunk;
  cVar5 = '\x01';
  uVar9 = 1 << ((byte)uVar8 & 0x1f);
  if (3 < uVar8) {
    uVar8 = uVar9;
    cVar4 = '\x04';
    do {
      cVar5 = cVar4;
      if (uVar8 < 100) {
        cVar5 = cVar5 + -2;
        goto LAB_0016455c;
      }
      if (uVar8 < 1000) {
        cVar5 = cVar5 + -1;
        goto LAB_0016455c;
      }
      if (uVar8 < 10000) goto LAB_0016455c;
      bVar3 = 99999 < uVar8;
      uVar8 = uVar8 / 10000;
      cVar4 = cVar5 + '\x04';
    } while (bVar3);
    cVar5 = cVar5 + '\x01';
  }
LAB_0016455c:
  local_70 = local_60;
  std::__cxx11::string::_M_construct((ulong)&local_70,cVar5);
  std::__detail::__to_chars_10_impl<unsigned_int>(local_70,local_68,uVar9);
  plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x18c24b);
  plVar7 = plVar6 + 2;
  if ((long *)*plVar6 == plVar7) {
    local_80 = *plVar7;
    lStack_78 = plVar6[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar7;
    local_90 = (long *)*plVar6;
  }
  local_88 = plVar6[1];
  *plVar6 = (long)plVar7;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_90);
  plVar7 = plVar6 + 2;
  if ((long *)*plVar6 == plVar7) {
    local_a0 = *plVar7;
    lStack_98 = plVar6[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *plVar7;
    local_b0 = (long *)*plVar6;
  }
  local_a8 = plVar6[1];
  *plVar6 = (long)plVar7;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  std::__cxx11::string::_M_append((char *)psVar1,(ulong)local_b0);
  if (local_b0 != &local_a0) {
    operator_delete(local_b0);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90);
  }
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  local_70 = local_60;
  std::__cxx11::string::_M_construct((ulong)&local_70,'\a');
  std::__detail::__to_chars_10_impl<unsigned_long>(local_70,local_68,0x100000);
  plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x18c262);
  plVar7 = plVar6 + 2;
  if ((long *)*plVar6 == plVar7) {
    local_80 = *plVar7;
    lStack_78 = plVar6[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar7;
    local_90 = (long *)*plVar6;
  }
  local_88 = plVar6[1];
  *plVar6 = (long)plVar7;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_90);
  plVar7 = plVar6 + 2;
  if ((long *)*plVar6 == plVar7) {
    local_a0 = *plVar7;
    lStack_98 = plVar6[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *plVar7;
    local_b0 = (long *)*plVar6;
  }
  local_a8 = plVar6[1];
  *plVar6 = (long)plVar7;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  std::__cxx11::string::_M_append((char *)psVar1,(ulong)local_b0);
  if (local_b0 != &local_a0) {
    operator_delete(local_b0);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90);
  }
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  uVar8 = (local_50->thread).m_unrollFactor;
  cVar5 = '\x01';
  if (9 < uVar8) {
    uVar9 = uVar8;
    cVar4 = '\x04';
    do {
      cVar5 = cVar4;
      if (uVar9 < 100) {
        cVar5 = cVar5 + -2;
        goto LAB_001647db;
      }
      if (uVar9 < 1000) {
        cVar5 = cVar5 + -1;
        goto LAB_001647db;
      }
      if (uVar9 < 10000) goto LAB_001647db;
      bVar3 = 99999 < uVar9;
      uVar9 = uVar9 / 10000;
      cVar4 = cVar5 + '\x04';
    } while (bVar3);
    cVar5 = cVar5 + '\x01';
  }
LAB_001647db:
  local_90 = &local_80;
  std::__cxx11::string::_M_construct((ulong)&local_90,cVar5);
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_90,(uint)local_88,uVar8);
  plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,0x18c270);
  plVar7 = plVar6 + 2;
  if ((long *)*plVar6 == plVar7) {
    local_a0 = *plVar7;
    lStack_98 = plVar6[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *plVar7;
    local_b0 = (long *)*plVar6;
  }
  local_a8 = plVar6[1];
  *plVar6 = (long)plVar7;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  std::__cxx11::string::_M_append((char *)psVar1,(ulong)local_b0);
  if (local_b0 != &local_a0) {
    operator_delete(local_b0);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90);
  }
  return;
}

Assistant:

xmrig::OclCnRunner::OclCnRunner(size_t index, const OclLaunchData &data) : OclBaseRunner(index, data)
{
    uint32_t stridedIndex = data.thread.stridedIndex();
    if (data.device.vendorId() == OCL_VENDOR_NVIDIA) {
        stridedIndex = 0;
    }
    else {
        stridedIndex = 2;
    }

    m_options += " -DITERATIONS="           + std::to_string(CnAlgo::CN_ITER >> 1) + "U";
    m_options += " -DMASK="                 + std::to_string(CnAlgo::CN_MASK) + "U";
    m_options += " -DWORKSIZE="             + std::to_string(data.thread.worksize()) + "U";
    m_options += " -DSTRIDED_INDEX="        + std::to_string(stridedIndex) + "U";
    m_options += " -DMEM_CHUNK_EXPONENT="   + std::to_string(1u << data.thread.memChunk()) + "U";
    m_options += " -DMEMORY="               + std::to_string(CnAlgo::CN_MEMORY) + "LU";
    m_options += " -DCN_UNROLL="            + std::to_string(data.thread.unrollFactor());
}